

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getBoundViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *maxviol,
                   number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sumviol)

{
  pointer pnVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RCX;
  long lVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> *local_e8;
  uint local_dc;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (this->_hasSolReal == true) {
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),1);
    local_dc = (uint)in_RCX;
    if (((this->_solReal).field_0xc8 & 1) != 0) goto LAB_00351ebc;
  }
  if (this->_hasSolRational == true) {
    local_dc = (uint)CONCAT71((int7)((ulong)in_RCX >> 8),(this->_solRational).field_0xd0) &
               0xffffff01;
  }
  else {
    local_dc = 0;
  }
LAB_00351ebc:
  if ((char)local_dc != '\0') {
    local_e8 = &sumviol->m_backend;
    if ((this->_hasSolReal == false) && (this->_hasSolRational != false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_e8,0.0);
    lVar7 = (long)(this->_realLP->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
    if (0 < lVar7) {
      lVar5 = lVar7 * 0x38;
      do {
        iVar4 = (int)(lVar7 + -1);
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lowerUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_a0,this->_realLP,iVar4);
        SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::upperUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_68,this->_realLP,iVar4);
        pcVar6 = (cpp_dec_float<50U,_int,_void> *)
                 ((long)((this->_solReal)._primal.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 0xffffffffffffffff) + lVar5);
        local_128.fpclass = cpp_dec_float_finite;
        local_128.prec_elem = 10;
        local_128.data._M_elems[0] = 0;
        local_128.data._M_elems[1] = 0;
        local_128.data._M_elems[2] = 0;
        local_128.data._M_elems[3] = 0;
        local_128.data._M_elems[4] = 0;
        local_128.data._M_elems[5] = 0;
        local_128.data._M_elems._24_5_ = 0;
        local_128.data._M_elems[7]._1_3_ = 0;
        local_128.data._M_elems._32_5_ = 0;
        local_128.data._M_elems[9]._1_3_ = 0;
        local_128.exp = 0;
        local_128.neg = false;
        if (pcVar6 == &local_128) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_128,&local_a0);
          if (local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
            local_128.neg = (bool)(local_128.neg ^ 1);
          }
        }
        else {
          local_128.data._M_elems._32_5_ = local_a0.data._M_elems._32_5_;
          local_128.data._M_elems[9]._1_3_ = local_a0.data._M_elems[9]._1_3_;
          local_128.data._M_elems[4] = local_a0.data._M_elems[4];
          local_128.data._M_elems[5] = local_a0.data._M_elems[5];
          local_128.data._M_elems._24_5_ = local_a0.data._M_elems._24_5_;
          local_128.data._M_elems[7]._1_3_ = local_a0.data._M_elems[7]._1_3_;
          local_128.data._M_elems[0] = local_a0.data._M_elems[0];
          local_128.data._M_elems[1] = local_a0.data._M_elems[1];
          local_128.data._M_elems[2] = local_a0.data._M_elems[2];
          local_128.data._M_elems[3] = local_a0.data._M_elems[3];
          local_128.exp = local_a0.exp;
          local_128.neg = local_a0.neg;
          local_128.fpclass = local_a0.fpclass;
          local_128.prec_elem = local_a0.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_128,pcVar6);
        }
        if (local_128.fpclass != cpp_dec_float_NaN) {
          local_d8.fpclass = cpp_dec_float_finite;
          local_d8.prec_elem = 10;
          local_d8.data._M_elems[0] = 0;
          local_d8.data._M_elems[1] = 0;
          local_d8.data._M_elems[2] = 0;
          local_d8.data._M_elems[3] = 0;
          local_d8.data._M_elems[4] = 0;
          local_d8.data._M_elems[5] = 0;
          local_d8.data._M_elems._24_5_ = 0;
          local_d8.data._M_elems[7]._1_3_ = 0;
          local_d8.data._M_elems._32_5_ = 0;
          local_d8.data._M_elems[9]._1_3_ = 0;
          local_d8.exp = 0;
          local_d8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_128,&local_d8);
          if (0 < iVar4) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_e8,&local_128);
            if ((local_128.fpclass != cpp_dec_float_NaN) &&
               ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_128,&maxviol->m_backend);
              if (0 < iVar4) {
                *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
                     CONCAT35(local_128.data._M_elems[9]._1_3_,local_128.data._M_elems._32_5_);
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                     local_128.data._M_elems._16_8_;
                *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
                     CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_);
                *(undefined8 *)(maxviol->m_backend).data._M_elems = local_128.data._M_elems._0_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) =
                     local_128.data._M_elems._8_8_;
                (maxviol->m_backend).exp = local_128.exp;
                (maxviol->m_backend).neg = local_128.neg;
                (maxviol->m_backend).fpclass = local_128.fpclass;
                (maxviol->m_backend).prec_elem = local_128.prec_elem;
              }
            }
          }
        }
        pnVar1 = (this->_solReal)._primal.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar6 = (cpp_dec_float<50U,_int,_void> *)((long)(pnVar1 + 0xffffffffffffffff) + lVar5);
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        if (pcVar6 != &local_d8) {
          uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 8);
          local_d8.data._M_elems._32_5_ = SUB85(uVar2,0);
          local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar6->data)._M_elems;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 2);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
          uVar2 = *(undefined8 *)((pcVar6->data)._M_elems + 6);
          local_d8.data._M_elems._24_5_ = SUB85(uVar2,0);
          local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
          local_d8.exp = *(int *)((long)(pnVar1 + 0xffffffffffffffff) + 0x28U + lVar5);
          local_d8.neg = *(bool *)((long)(pnVar1 + 0xffffffffffffffff) + 0x2cU + lVar5);
          local_d8._48_8_ = *(undefined8 *)((long)(pnVar1 + 0xffffffffffffffff) + 0x30U + lVar5);
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_d8,&local_68);
        local_128.data._M_elems[0] = local_d8.data._M_elems[0];
        local_128.data._M_elems[1] = local_d8.data._M_elems[1];
        local_128.data._M_elems[2] = local_d8.data._M_elems[2];
        local_128.data._M_elems[3] = local_d8.data._M_elems[3];
        local_128.data._M_elems[4] = local_d8.data._M_elems[4];
        local_128.data._M_elems[5] = local_d8.data._M_elems[5];
        local_128.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
        local_128.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
        local_128.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
        local_128.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
        local_128.exp = local_d8.exp;
        local_128.neg = local_d8.neg;
        local_128.fpclass = local_d8.fpclass;
        local_128.prec_elem = local_d8.prec_elem;
        if (local_d8.fpclass != cpp_dec_float_NaN) {
          local_d8.fpclass = cpp_dec_float_finite;
          local_d8.prec_elem = 10;
          local_d8.data._M_elems[0] = 0;
          local_d8.data._M_elems[1] = 0;
          local_d8.data._M_elems[2] = 0;
          local_d8.data._M_elems[3] = 0;
          local_d8.data._M_elems[4] = 0;
          local_d8.data._M_elems[5] = 0;
          local_d8.data._M_elems._24_5_ = 0;
          local_d8.data._M_elems[7]._1_3_ = 0;
          local_d8.data._M_elems._32_5_ = 0;
          local_d8.data._M_elems[9]._1_3_ = 0;
          local_d8.exp = 0;
          local_d8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_128,&local_d8);
          if (0 < iVar4) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_e8,&local_128);
            if ((local_128.fpclass != cpp_dec_float_NaN) &&
               ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_128,&maxviol->m_backend);
              if (0 < iVar4) {
                *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
                     CONCAT35(local_128.data._M_elems[9]._1_3_,local_128.data._M_elems._32_5_);
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) =
                     local_128.data._M_elems._16_8_;
                *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
                     CONCAT35(local_128.data._M_elems[7]._1_3_,local_128.data._M_elems._24_5_);
                *(undefined8 *)(maxviol->m_backend).data._M_elems = local_128.data._M_elems._0_8_;
                *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) =
                     local_128.data._M_elems._8_8_;
                (maxviol->m_backend).exp = local_128.exp;
                (maxviol->m_backend).neg = local_128.neg;
                (maxviol->m_backend).fpclass = local_128.fpclass;
                (maxviol->m_backend).prec_elem = local_128.prec_elem;
              }
            }
          }
        }
        bVar3 = 1 < lVar7;
        lVar7 = lVar7 + -1;
        lVar5 = lVar5 + -0x38;
      } while (bVar3);
    }
  }
  return SUB41(local_dc,0);
}

Assistant:

bool SoPlexBase<R>::getBoundViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numCols() - 1; i >= 0; i--)
   {
      R lower = _realLP->lowerUnscaled(i);
      R upper = _realLP->upperUnscaled(i);
      R viol = lower - primal[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = primal[i] - upper;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}